

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O3

bool menu_bar_sub_item_active_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object cmd;
  Am_Value cmd_value;
  Am_Object win;
  Am_Object owner;
  Am_Object AStack_48;
  Am_Value local_40;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&local_20,0xcc,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_002694c3;
    }
  }
  local_30.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(self,0x68,0);
  Am_Object::operator=(&local_30,pAVar3);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    local_40.type = 0;
    local_40._2_6_ = 0;
    pAVar3 = Am_Object::Get(&local_30,0x1d3,0);
    Am_Object::operator=((Am_Object *)&local_40,pAVar3);
    bVar1 = Am_Object::Valid((Am_Object *)&local_40);
    if (!bVar1) {
LAB_0026941a:
      Am_Object::~Am_Object((Am_Object *)&local_40);
      goto LAB_00269424;
    }
    pAVar3 = Am_Object::Get((Am_Object *)&local_40,0xcc,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (bVar1) goto LAB_0026941a;
    Am_Object::~Am_Object((Am_Object *)&local_40);
    bVar1 = false;
  }
  else {
LAB_00269424:
    pAVar3 = Am_Object::Get(self,0xc5,1);
    Am_Value::Am_Value(&local_40,pAVar3);
    bVar1 = true;
    if (local_40.type == 0xa001) {
      Am_Object::Am_Object(&AStack_48,&local_40);
      Am_Object::Am_Object(&local_28,&Am_Command);
      bVar2 = Am_Object::Is_Instance_Of(&AStack_48,&local_28);
      Am_Object::~Am_Object(&local_28);
      if (bVar2) {
        pAVar3 = Am_Object::Get(&AStack_48,0xcc,0);
        bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
      }
      Am_Object::~Am_Object(&AStack_48);
    }
    Am_Value::~Am_Value(&local_40);
  }
  Am_Object::~Am_Object(&local_30);
LAB_002694c3:
  Am_Object::~Am_Object(&local_20);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, menu_bar_sub_item_active)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && !(bool)owner.Get(Am_ACTIVE))
    return false;
  // now check the main-item I am attached to, if any
  Am_Object win;
  win = self.Get(Am_WINDOW);
  if (win.Valid()) {
    Am_Object main_item;
    main_item = win.Get(Am_FOR_ITEM);
    if (main_item.Valid() && !(bool)main_item.Get(Am_ACTIVE))
      return false;
  }
  //now check my command object, if any
  //   Am_Object cmd = self.GV_Object(Am_COMMAND);
  //   if( cmd.Valid() && cmd.Is_Instance_Of(Am_Command) )
  //     return cmd.GV(Am_ACTIVE);
  //   else
  //     return true;
  Am_Value cmd_value = self.Peek(Am_COMMAND);
  if (cmd_value.type == Am_OBJECT) {
    Am_Object cmd = cmd_value;
    if (cmd.Is_Instance_Of(Am_Command))
      return cmd.Get(Am_ACTIVE);
  }
  return true;
}